

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::TorsionTypesSectionParser::parseLine
          (TorsionTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  pointer pcVar1;
  int iVar2;
  TorsionType *torsionType;
  string at1;
  string torsionConvention;
  TorsionTypeParser ttParser;
  string remainder;
  string at4;
  string at3;
  string at2;
  StringTokenizer tokenizer;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [48];
  bool local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  StringTokenizer local_80;
  
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,(string *)local_138);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  TorsionTypeParser::TorsionTypeParser((TorsionTypeParser *)local_138);
  pcVar1 = (this->options_->TorsionAngleConvention).data_._M_dataplus._M_p;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar1,
             pcVar1 + (this->options_->TorsionAngleConvention).data_._M_string_length);
  std::locale::locale((locale *)&local_178);
  toUpper<std::__cxx11::string>(&local_158,(locale *)&local_178);
  std::locale::~locale((locale *)&local_178);
  iVar2 = std::__cxx11::string::compare((char *)&local_158);
  local_108 = iVar2 == 0;
  iVar2 = StringTokenizer::countTokens(&local_80);
  if (iVar2 < 5) {
    snprintf(painCave.errMsg,2000,"TorsionTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_178,&local_80);
    StringTokenizer::nextToken_abi_cxx11_(&local_a0,&local_80);
    StringTokenizer::nextToken_abi_cxx11_(&local_c0,&local_80);
    StringTokenizer::nextToken_abi_cxx11_(&local_e0,&local_80);
    StringTokenizer::getRemainingString_abi_cxx11_(&local_100,&local_80);
    torsionType = TorsionTypeParser::parseLine((TorsionTypeParser *)local_138,&local_100);
    if (torsionType != (TorsionType *)0x0) {
      ForceField::addTorsionType(ff,&local_178,&local_a0,&local_c0,&local_e0,torsionType);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
               *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TorsionTypesSectionParser::parseLine(ForceField& ff,
                                            const std::string& line,
                                            int lineNo) {
    StringTokenizer tokenizer(line);
    TorsionTypeParser ttParser;
    TorsionType* torsionType = NULL;

    std::string torsionConvention = options_.getTorsionAngleConvention();
    toUpper(torsionConvention);

    if (torsionConvention.compare("180_IS_TRANS") == 0)
      ttParser.Trans180();
    else
      ttParser.Cis180();

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "TorsionTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string at4       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();

    try {
      torsionType = ttParser.parseLine(remainder);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TorsionTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (torsionType != NULL) {
      ff.addTorsionType(at1, at2, at3, at4, torsionType);
    }
  }